

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmLocalUnixMakefileGenerator3::AppendCustomDepends
          (cmLocalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depends,vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *ccs)

{
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  computeInternalDepfile;
  pointer cc;
  pointer pcVar1;
  _Any_data local_1f8;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d8;
  string local_1b0;
  cmCustomCommandGenerator ccg;
  
  pcVar1 = (ccs->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (cc = (ccs->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
            super__Vector_impl_data._M_start; cc != pcVar1; cc = cc + 1) {
    GetConfigName_abi_cxx11_(&local_1b0,this);
    local_1d8._M_engaged = false;
    local_1f8._M_unused._M_object = (void *)0x0;
    local_1f8._8_8_ = 0;
    local_1e8 = 0;
    uStack_1e0 = 0;
    computeInternalDepfile.super__Function_base._M_functor._8_8_ = depends;
    computeInternalDepfile.super__Function_base._M_functor._M_unused._M_object = &local_1f8;
    computeInternalDepfile.super__Function_base._M_manager = (_Manager_type)pcVar1;
    computeInternalDepfile._M_invoker = (_Invoker_type)cc;
    cmCustomCommandGenerator::cmCustomCommandGenerator
              (&ccg,cc,&local_1b0,(cmLocalGenerator *)this,true,
               (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_1d8,computeInternalDepfile);
    std::_Function_base::~_Function_base((_Function_base *)&local_1f8);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset(&local_1d8);
    std::__cxx11::string::~string((string *)&local_1b0);
    AppendCustomDepend(this,depends,&ccg);
    cmCustomCommandGenerator::~cmCustomCommandGenerator(&ccg);
  }
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::AppendCustomDepends(
  std::vector<std::string>& depends, const std::vector<cmCustomCommand>& ccs)
{
  for (cmCustomCommand const& cc : ccs) {
    cmCustomCommandGenerator ccg(cc, this->GetConfigName(), this);
    this->AppendCustomDepend(depends, ccg);
  }
}